

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O1

bool __thiscall
CLI::App::_parse_single
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool *positional_only)

{
  Option *pOVar1;
  pointer psVar2;
  element_type *peVar3;
  pointer pbVar4;
  pointer pcVar5;
  Classifier current_type;
  bool bVar6;
  Option_p *opt;
  pointer puVar7;
  pointer psVar8;
  HorribleError *this_00;
  Classifier local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  if (*positional_only == false) {
    current_type = _recognize(this,(string *)
                                   ((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish + -1),true);
  }
  else {
    current_type = NONE;
  }
  switch(current_type) {
  case NONE:
    bVar6 = _parse_positional(this,args,false);
    if (!bVar6) {
      return bVar6;
    }
    if (this->positionals_at_end_ != true) {
      return bVar6;
    }
    *positional_only = true;
    return bVar6;
  case POSITIONAL_MARK:
    pbVar4 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    (args->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
    pcVar5 = pbVar4[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != &pbVar4[-1].field_2) {
      operator_delete(pcVar5,pbVar4[-1].field_2._M_allocated_capacity + 1);
    }
    *positional_only = true;
    puVar7 = (this->options_).
             super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while ((bVar6 = puVar7 != (this->options_).
                              super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish, bVar6 &&
           ((pOVar1 = (puVar7->_M_t).
                      super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                      super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                      super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
            (pOVar1->pname_)._M_string_length == 0 ||
            (pOVar1->expected_min_ * pOVar1->type_size_min_ <=
             (int)((ulong)((long)*(pointer *)
                                  ((long)&(pOVar1->results_).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  + 8) -
                          *(long *)&(pOVar1->results_).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl) >> 5)))))) {
      puVar7 = puVar7 + 1;
    }
    if ((bVar6) || (this->parent_ == (App *)0x0)) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"--","");
      local_61 = POSITIONAL_MARK;
      if (this->allow_extras_ == false) {
        psVar8 = (this->subcommands_).
                 super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar2 = (this->subcommands_).
                 super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (psVar8 != psVar2) {
          bVar6 = false;
          do {
            peVar3 = (psVar8->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            if (((peVar3->name_)._M_string_length == 0) && (peVar3->allow_extras_ == true)) {
              ::std::
              vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
              ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
                        ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                          *)&peVar3->missing_,&local_61,&local_60);
              if (!bVar6) goto LAB_0013a27d;
              break;
            }
            psVar8 = psVar8 + 1;
            bVar6 = psVar8 == psVar2;
          } while (!bVar6);
        }
      }
      ::std::
      vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
      ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
                ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                  *)&this->missing_,&local_61,&local_60);
LAB_0013a27d:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      return true;
    }
    break;
  case SHORT:
  case LONG:
  case WINDOWS_STYLE:
    bVar6 = _parse_arg(this,args,current_type,false);
    return bVar6;
  case SUBCOMMAND:
    bVar6 = _parse_subcommand(this,args);
    return bVar6;
  case SUBCOMMAND_TERMINATOR:
    pbVar4 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    (args->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
    pcVar5 = pbVar4[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != &pbVar4[-1].field_2) {
      operator_delete(pcVar5,pbVar4[-1].field_2._M_allocated_capacity + 1);
    }
    break;
  default:
    this_00 = (HorribleError *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"unrecognized classifier (you should not see this!)","");
    HorribleError::HorribleError(this_00,&local_40);
    __cxa_throw(this_00,&HorribleError::typeinfo,Error::~Error);
  }
  return false;
}

Assistant:

CLI11_INLINE bool App::_parse_single(std::vector<std::string> &args, bool &positional_only) {
    bool retval = true;
    detail::Classifier classifier = positional_only ? detail::Classifier::NONE : _recognize(args.back());
    switch(classifier) {
    case detail::Classifier::POSITIONAL_MARK:
        args.pop_back();
        positional_only = true;
        if((!_has_remaining_positionals()) && (parent_ != nullptr)) {
            retval = false;
        } else {
            _move_to_missing(classifier, "--");
        }
        break;
    case detail::Classifier::SUBCOMMAND_TERMINATOR:
        // treat this like a positional mark if in the parent app
        args.pop_back();
        retval = false;
        break;
    case detail::Classifier::SUBCOMMAND:
        retval = _parse_subcommand(args);
        break;
    case detail::Classifier::LONG:
    case detail::Classifier::SHORT:
    case detail::Classifier::WINDOWS_STYLE:
        // If already parsed a subcommand, don't accept options_
        retval = _parse_arg(args, classifier, false);
        break;
    case detail::Classifier::NONE:
        // Probably a positional or something for a parent (sub)command
        retval = _parse_positional(args, false);
        if(retval && positionals_at_end_) {
            positional_only = true;
        }
        break;
        // LCOV_EXCL_START
    default:
        throw HorribleError("unrecognized classifier (you should not see this!)");
        // LCOV_EXCL_STOP
    }
    return retval;
}